

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Parser
coda_XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Bool XVar2;
  XML_ParamEntityParsing XVar3;
  undefined4 uVar4;
  DTD *oldTable;
  XML_StartElementHandler p_Var5;
  XML_EndElementHandler p_Var6;
  XML_CharacterDataHandler p_Var7;
  XML_ProcessingInstructionHandler p_Var8;
  XML_NotStandaloneHandler p_Var9;
  XML_ExternalEntityRefHandler p_Var10;
  XML_Parser pXVar11;
  KEY pXVar12;
  XML_Bool XVar13;
  int iVar14;
  XML_Parser parser;
  XML_Char *pXVar15;
  NAMED *pNVar16;
  NAMED *pNVar17;
  PREFIX *pPVar18;
  KEY pXVar19;
  NAMED *pNVar20;
  code *pcVar21;
  DTD *pDVar22;
  XML_Parser pXVar23;
  NAMED **ppNVar24;
  NAMED **ppNVar25;
  long lVar26;
  long lVar27;
  char cVar28;
  XML_Char tmp [2];
  NAMED **local_108;
  XML_Char local_c2 [2];
  XML_Char *local_c0;
  XML_Parser local_b8;
  ELEMENT_TYPE *local_b0;
  XML_XmlDeclHandler local_a8;
  XML_EntityDeclHandler local_a0;
  XML_AttlistDeclHandler local_98;
  XML_ElementDeclHandler local_90;
  XML_UnknownEncodingHandler local_88;
  XML_SkippedEntityHandler local_80;
  unsigned_long local_78;
  XML_EndNamespaceDeclHandler local_70;
  XML_StartNamespaceDeclHandler local_68;
  XML_NotationDeclHandler local_60;
  XML_UnparsedEntityDeclHandler local_58;
  XML_DefaultHandler local_50;
  XML_EndCdataSectionHandler local_48;
  XML_StartCdataSectionHandler local_40;
  XML_CommentHandler local_38;
  
  if (oldParser != (XML_Parser)0x0) {
    oldTable = oldParser->m_dtd;
    p_Var5 = oldParser->m_startElementHandler;
    p_Var6 = oldParser->m_endElementHandler;
    p_Var7 = oldParser->m_characterDataHandler;
    p_Var8 = oldParser->m_processingInstructionHandler;
    local_38 = oldParser->m_commentHandler;
    local_40 = oldParser->m_startCdataSectionHandler;
    local_48 = oldParser->m_endCdataSectionHandler;
    local_50 = oldParser->m_defaultHandler;
    local_58 = oldParser->m_unparsedEntityDeclHandler;
    local_60 = oldParser->m_notationDeclHandler;
    local_68 = oldParser->m_startNamespaceDeclHandler;
    local_70 = oldParser->m_endNamespaceDeclHandler;
    XVar13 = oldParser->m_defaultExpandInternalEntities;
    XVar1 = oldParser->m_ns_triplets;
    pDVar22 = (DTD *)0x0;
    if (context == (XML_Char *)0x0) {
      pDVar22 = oldTable;
    }
    XVar2 = oldParser->m_reparseDeferralEnabled;
    p_Var9 = oldParser->m_notStandaloneHandler;
    p_Var10 = oldParser->m_externalEntityRefHandler;
    local_80 = oldParser->m_skippedEntityHandler;
    local_88 = oldParser->m_unknownEncodingHandler;
    local_90 = oldParser->m_elementDeclHandler;
    local_98 = oldParser->m_attlistDeclHandler;
    local_a0 = oldParser->m_entityDeclHandler;
    local_a8 = oldParser->m_xmlDeclHandler;
    local_b0 = oldParser->m_declElementType;
    pXVar23 = (XML_Parser)oldParser->m_userData;
    local_b8 = (XML_Parser)oldParser->m_handlerArg;
    pXVar11 = oldParser->m_externalEntityRefHandlerArg;
    XVar3 = oldParser->m_paramEntityParsing;
    iVar14 = (oldParser->m_prologState).inEntityValue;
    local_78 = oldParser->m_hash_secret_salt;
    if (oldParser->m_ns == '\0') {
      pXVar15 = (XML_Char *)0x0;
    }
    else {
      local_c2[0] = oldParser->m_namespaceSeparator;
      pXVar15 = local_c2;
      local_c2[1] = 0;
    }
    local_c0 = context;
    parser = parserCreate(encodingName,&oldParser->m_mem,pXVar15,pDVar22);
    if (parser != (XML_Parser)0x0) {
      parser->m_startElementHandler = p_Var5;
      parser->m_endElementHandler = p_Var6;
      parser->m_characterDataHandler = p_Var7;
      parser->m_processingInstructionHandler = p_Var8;
      parser->m_commentHandler = local_38;
      parser->m_startCdataSectionHandler = local_40;
      parser->m_endCdataSectionHandler = local_48;
      parser->m_defaultHandler = local_50;
      parser->m_unparsedEntityDeclHandler = local_58;
      parser->m_notationDeclHandler = local_60;
      parser->m_startNamespaceDeclHandler = local_68;
      parser->m_endNamespaceDeclHandler = local_70;
      parser->m_notStandaloneHandler = p_Var9;
      parser->m_externalEntityRefHandler = p_Var10;
      parser->m_skippedEntityHandler = local_80;
      parser->m_unknownEncodingHandler = local_88;
      parser->m_elementDeclHandler = local_90;
      parser->m_attlistDeclHandler = local_98;
      parser->m_entityDeclHandler = local_a0;
      parser->m_xmlDeclHandler = local_a8;
      parser->m_declElementType = local_b0;
      parser->m_userData = pXVar23;
      if (pXVar23 != local_b8) {
        pXVar23 = parser;
      }
      parser->m_handlerArg = pXVar23;
      if (pXVar11 != oldParser) {
        parser->m_externalEntityRefHandlerArg = pXVar11;
      }
      parser->m_defaultExpandInternalEntities = XVar13;
      parser->m_ns_triplets = XVar1;
      parser->m_hash_secret_salt = local_78;
      parser->m_reparseDeferralEnabled = XVar2;
      parser->m_parentParser = oldParser;
      parser->m_paramEntityParsing = XVar3;
      (parser->m_prologState).inEntityValue = iVar14;
      if (local_c0 == (XML_Char *)0x0) {
        parser->m_isParamEntity = '\x01';
        coda_XmlPrologStateInitExternalEntity(&parser->m_prologState);
        pcVar21 = externalParEntInitProcessor;
LAB_0016d4d5:
        parser->m_processor = pcVar21;
        return parser;
      }
      pDVar22 = parser->m_dtd;
      ppNVar24 = (oldTable->prefixes).v;
      if (ppNVar24 == (NAMED **)0x0) {
        ppNVar25 = (NAMED **)0x0;
      }
      else {
        ppNVar25 = ppNVar24 + (oldTable->prefixes).size;
      }
      pool = &pDVar22->pool;
      table = &pDVar22->prefixes;
LAB_0016d4fa:
      do {
        if (ppNVar24 == ppNVar25) {
          pNVar16 = (NAMED *)0x0;
        }
        else {
          pNVar16 = *ppNVar24;
          ppNVar24 = ppNVar24 + 1;
          if (pNVar16 == (NAMED *)0x0) goto LAB_0016d4fa;
        }
        if (pNVar16 == (NAMED *)0x0) {
          cVar28 = '\x02';
        }
        else {
          pXVar15 = poolCopyString(pool,pNVar16->name);
          if (pXVar15 == (XML_Char *)0x0) {
            cVar28 = '\x01';
          }
          else {
            pNVar16 = lookup(oldParser,table,pXVar15,0x10);
            cVar28 = pNVar16 == (NAMED *)0x0;
          }
        }
      } while (cVar28 == '\0');
      if (cVar28 == '\x02') {
        ppNVar24 = (oldTable->attributeIds).v;
        if (ppNVar24 == (NAMED **)0x0) {
          local_108 = (NAMED **)0x0;
        }
        else {
          local_108 = ppNVar24 + (oldTable->attributeIds).size;
        }
        table_00 = &pDVar22->attributeIds;
LAB_0016d5aa:
        do {
          if (ppNVar24 == local_108) {
            pNVar16 = (NAMED *)0x0;
          }
          else {
            pNVar16 = *ppNVar24;
            ppNVar24 = ppNVar24 + 1;
            if (pNVar16 == (NAMED *)0x0) goto LAB_0016d5aa;
          }
          if (pNVar16 == (NAMED *)0x0) {
            iVar14 = 4;
          }
          else if (((pDVar22->pool).ptr == (pDVar22->pool).end) &&
                  (XVar13 = poolGrow(pool), XVar13 == '\0')) {
            iVar14 = 1;
          }
          else {
            pXVar15 = (pDVar22->pool).ptr;
            (pDVar22->pool).ptr = pXVar15 + 1;
            *pXVar15 = '\0';
            pXVar15 = poolCopyString(pool,pNVar16->name);
            iVar14 = 1;
            if ((pXVar15 != (XML_Char *)0x0) &&
               (pNVar17 = lookup(oldParser,table_00,pXVar15 + 1,0x18), pNVar17 != (NAMED *)0x0)) {
              *(undefined1 *)&pNVar17[2].name = *(undefined1 *)&pNVar16[2].name;
              pXVar19 = pNVar16[1].name;
              iVar14 = 0;
              if (pXVar19 != (KEY)0x0) {
                *(undefined1 *)((long)&pNVar17[2].name + 1) =
                     *(undefined1 *)((long)&pNVar16[2].name + 1);
                pPVar18 = &pDVar22->defaultPrefix;
                if ((PREFIX *)pXVar19 != &oldTable->defaultPrefix) {
                  pPVar18 = (PREFIX *)lookup(oldParser,table,*(KEY *)pXVar19,0);
                }
                pNVar17[1].name = (KEY)pPVar18;
              }
            }
          }
        } while (iVar14 == 0);
        if (iVar14 == 4) {
          ppNVar24 = (oldTable->elementTypes).v;
          if (ppNVar24 == (NAMED **)0x0) {
            ppNVar25 = (NAMED **)0x0;
          }
          else {
            ppNVar25 = ppNVar24 + (oldTable->elementTypes).size;
          }
LAB_0016d6db:
          do {
            if (ppNVar24 == ppNVar25) {
              pNVar16 = (NAMED *)0x0;
            }
            else {
              pNVar16 = *ppNVar24;
              ppNVar24 = ppNVar24 + 1;
              if (pNVar16 == (NAMED *)0x0) goto LAB_0016d6db;
            }
            if (pNVar16 == (NAMED *)0x0) {
              iVar14 = 6;
            }
            else {
              pXVar15 = poolCopyString(pool,pNVar16->name);
              iVar14 = 1;
              if (pXVar15 != (XML_Char *)0x0) {
                pNVar17 = lookup(oldParser,&pDVar22->elementTypes,pXVar15,0x28);
                if (pNVar17 == (NAMED *)0x0) {
LAB_0016d84c:
                  iVar14 = 1;
                }
                else {
                  if ((long)*(int *)&pNVar16[3].name != 0) {
                    pXVar19 = (KEY)(*(parser->m_mem).malloc_fcn)
                                             ((long)*(int *)&pNVar16[3].name * 0x18);
                    pNVar17[4].name = pXVar19;
                    if (pXVar19 == (KEY)0x0) goto LAB_0016d84c;
                  }
                  if (pNVar16[2].name != (KEY)0x0) {
                    pNVar20 = lookup(oldParser,table_00,*(KEY *)pNVar16[2].name,0);
                    pNVar17[2].name = (KEY)pNVar20;
                  }
                  uVar4 = *(undefined4 *)&pNVar16[3].name;
                  *(undefined4 *)&pNVar17[3].name = uVar4;
                  *(undefined4 *)((long)&pNVar17[3].name + 4) = uVar4;
                  if (pNVar16[1].name != (KEY)0x0) {
                    pNVar20 = lookup(oldParser,table,*(KEY *)pNVar16[1].name,0);
                    pNVar17[1].name = (KEY)pNVar20;
                  }
                  if (0 < *(int *)&pNVar17[3].name) {
                    lVar26 = 0;
                    lVar27 = 0;
                    do {
                      pNVar20 = lookup(oldParser,table_00,
                                       (KEY)**(undefined8 **)(pNVar16[4].name + lVar26),0);
                      pXVar19 = pNVar17[4].name;
                      *(NAMED **)(pXVar19 + lVar26) = pNVar20;
                      pXVar12 = pNVar16[4].name;
                      pXVar19[lVar26 + 8] = pXVar12[lVar26 + 8];
                      pXVar15 = *(XML_Char **)(pXVar12 + lVar26 + 0x10);
                      if (pXVar15 == (XML_Char *)0x0) {
                        pXVar19 = pXVar19 + lVar26 + 0x10;
                        pXVar19[0] = '\0';
                        pXVar19[1] = '\0';
                        pXVar19[2] = '\0';
                        pXVar19[3] = '\0';
                        pXVar19[4] = '\0';
                        pXVar19[5] = '\0';
                        pXVar19[6] = '\0';
                        pXVar19[7] = '\0';
                      }
                      else {
                        pXVar15 = poolCopyString(pool,pXVar15);
                        *(XML_Char **)(pNVar17[4].name + lVar26 + 0x10) = pXVar15;
                        if (pXVar15 == (XML_Char *)0x0) goto LAB_0016d84c;
                      }
                      lVar27 = lVar27 + 1;
                      lVar26 = lVar26 + 0x18;
                    } while (lVar27 < *(int *)&pNVar17[3].name);
                  }
                  iVar14 = 0;
                }
              }
            }
          } while (iVar14 == 0);
          if (((iVar14 == 6) &&
              (iVar14 = copyEntityTable(oldParser,&pDVar22->generalEntities,pool,
                                        &oldTable->generalEntities), iVar14 != 0)) &&
             (iVar14 = copyEntityTable(oldParser,&pDVar22->paramEntities,pool,
                                       &oldTable->paramEntities), iVar14 != 0)) {
            pDVar22->paramEntityRead = oldTable->paramEntityRead;
            pDVar22->keepProcessing = oldTable->keepProcessing;
            pDVar22->hasParamEntityRefs = oldTable->hasParamEntityRefs;
            pDVar22->standalone = oldTable->standalone;
            pDVar22->in_eldecl = oldTable->in_eldecl;
            pDVar22->scaffold = oldTable->scaffold;
            pDVar22->contentStringLen = oldTable->contentStringLen;
            pDVar22->scaffSize = oldTable->scaffSize;
            pDVar22->scaffLevel = oldTable->scaffLevel;
            pDVar22->scaffIndex = oldTable->scaffIndex;
            XVar13 = setContext(parser,local_c0);
            if (XVar13 != '\0') {
              pcVar21 = externalEntityInitProcessor;
              goto LAB_0016d4d5;
            }
          }
        }
      }
      coda_XML_ParserFree(parser);
    }
  }
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;
  XML_Bool oldReparseDeferralEnabled;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;
  oldReparseDeferralEnabled = parser->m_reparseDeferralEnabled;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_reparseDeferralEnabled = oldReparseDeferralEnabled;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}